

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O3

BOOL MakeOrganyaWave(char track,char wave_no,char pipi)

{
  bool bVar1;
  
  bVar1 = wave_no < 'd' && audio_backend_initialised;
  if (wave_no < 'd' && audio_backend_initialised) {
    ReleaseOrganyaObject(track);
    MakeSoundObject8(wave_data[wave_no],track,pipi);
  }
  return bVar1;
}

Assistant:

BOOL MakeOrganyaWave(signed char track, signed char wave_no, signed char pipi)
{
	if (!audio_backend_initialised)
		return FALSE;

	if (wave_no > 99)
		return FALSE;

	ReleaseOrganyaObject(track);
	MakeSoundObject8(wave_data[wave_no], track, pipi);

	return TRUE;
}